

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bro.cpp
# Opt level: O0

void __thiscall bro::bro(bro *this,int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  rep rVar3;
  undefined1 auVar4 [16];
  duration<long,_std::ratio<1L,_1000000000L>_> local_e88;
  duration<long,_std::ratio<1L,_1000000000L>_> local_e80;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> nanoseconds;
  time_point end;
  time_point start;
  brotli_decoder_state state;
  brotli_decoder dec;
  istream *is;
  char local_258 [8];
  ifstream ifs;
  undefined1 local_50 [8];
  args_t args;
  char **argv_local;
  int argc_local;
  bro *this_local;
  
  args._40_8_ = argv;
  args_t::args_t((args_t *)local_50,argc,argv);
  if (((byte)args.repeat & 1) == 0) {
    std::ifstream::ifstream(local_258);
    if (args._0_8_ != 0) {
      std::ifstream::open(local_258,args._0_4_);
    }
    andyzip::brotli_decoder::brotli_decoder
              ((brotli_decoder *)&state.block_count_tables[2].field_0x7f);
    andyzip::brotli_decoder_state::brotli_decoder_state((brotli_decoder_state *)&start);
    bVar1 = std::ios::bad();
    if (((bVar1 & 1) == 0) && (bVar1 = std::ios::eof(), (bVar1 & 1) == 0)) {
      end.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      std::istream::read(local_258,0x1331d0);
      state.log_file = (FILE *)bro::tmp;
      state.src._0_4_ = 0;
      iVar2 = std::istream::gcount();
      state.src._4_4_ = iVar2 << 3;
      start.__d.__r = (duration)fopen("log.txt","wb");
      andyzip::brotli_decoder::decode
                ((brotli_decoder *)&state.block_count_tables[2].field_0x7f,
                 (brotli_decoder_state *)&start);
      nanoseconds.__r = std::chrono::_V2::system_clock::now();
      local_e88.__r =
           (rep)std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&nanoseconds,&end);
      local_e80.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                          (&local_e88);
      printf("err=%d\n",(ulong)(uint)state.dest_max);
      printf("%d\n",(ulong)(uint)state.distance_context_map._248_4_);
      if ((local_50[1] & 1U) != 0) {
        auVar4[4] = state.distance_context_map[0xfc];
        auVar4[5] = state.distance_context_map[0xfd];
        auVar4[6] = state.distance_context_map[0xfe];
        auVar4[7] = state.distance_context_map[0xff];
        auVar4[0] = state.distance_context_map[0xf8];
        auVar4[1] = state.distance_context_map[0xf9];
        auVar4[2] = state.distance_context_map[0xfa];
        auVar4[3] = state.distance_context_map[0xfb];
        auVar4[8] = state.distance_context_map[0xfc];
        auVar4[9] = state.distance_context_map[0xfd];
        auVar4[10] = state.distance_context_map[0xfe];
        auVar4[0xb] = state.distance_context_map[0xff];
        auVar4._12_4_ = 0x45300000;
        rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_e80);
        printf("Brotli decompression speed: %0.f MB/s\n",
               (((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,state.distance_context_map._248_4_) -
                4503599627370496.0)) * 953.67431640625) / (double)rVar3);
      }
    }
    andyzip::brotli_decoder_state::~brotli_decoder_state((brotli_decoder_state *)&start);
    std::ifstream::~ifstream(local_258);
  }
  return;
}

Assistant:

bro(int argc, const char **argv) {
    args_t args(argc, argv);
    if (args.fail) return;

    #ifdef MSC_VER
      _setmode(_fileno(stdin), _O_BINARY);
      _setmode(_fileno(stdout), _O_BINARY);
    #endif

    std::ifstream ifs;
    if (args.input_file) {
      ifs.open(args.input_file, std::ios::binary);
    }

    std::istream &is = args.input_file ? static_cast<std::istream&>(ifs) : std::cin;
    
    //std::ostream os = !args.output_file ? std::cout : (std::ostream&)std::ofstream(args.output_file, std::ios::binary);

    andyzip::brotli_decoder dec;

    andyzip::brotli_decoder_state state;

    static char tmp[0x1000000];
    if (!ifs.bad() && !ifs.eof()) {
      auto start = std::chrono::high_resolution_clock::now();
      ifs.read(tmp, sizeof(tmp));
      state.src = tmp;
      state.bitptr = 0;
      state.bitptr_max = (std::uint32_t)(ifs.gcount() * 8);
      state.log_file = fopen("log.txt", "wb");
      dec.decode(state);
      auto end = std::chrono::high_resolution_clock::now();
      auto nanoseconds = std::chrono::duration_cast<std::chrono::nanoseconds>(end - start);
      printf("err=%d\n", (int)state.error);
      printf("%d\n", (int)state.bytes_written);
      if (args.verbose) {
        printf("Brotli decompression speed: %0.f MB/s\n", (1000000000.0/1024/1024) * state.bytes_written / nanoseconds.count());
      }
    }
  }